

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O3

int on_data_chunk_recv(nghttp2_session *session,uint8_t flags,int32_t stream_id,uint8_t *mem,
                      size_t len,void *userp)

{
  size_t *psVar1;
  RTSP *pRVar2;
  ulong uVar3;
  Curl_easy *data;
  int iVar4;
  size_t __n;
  
  data = (Curl_easy *)nghttp2_session_get_stream_user_data(session,stream_id);
  iVar4 = 0;
  if (data != (Curl_easy *)0x0) {
    pRVar2 = (data->req).p.rtsp;
    if (pRVar2 == (RTSP *)0x0) {
      iVar4 = -0x386;
    }
    else {
      uVar3 = (pRVar2->http_wrapper).len;
      __n = len;
      if (uVar3 < len) {
        __n = uVar3;
      }
      memcpy((pRVar2->http_wrapper).mem + (pRVar2->http_wrapper).memlen,mem,__n);
      psVar1 = &(pRVar2->http_wrapper).len;
      *psVar1 = *psVar1 - __n;
      psVar1 = &(pRVar2->http_wrapper).memlen;
      *psVar1 = *psVar1 + __n;
      psVar1 = &(data->state).drain;
      *psVar1 = *psVar1 + 1;
      *(long *)((long)userp + 0x4e0) = *(long *)((long)userp + 0x4e0) + 1;
      if (*(Curl_easy **)((long)userp + 0x4a0) != data) {
        Curl_expire(data,0,EXPIRE_RUN_NOW);
      }
      if (len < uVar3 || len - uVar3 == 0) {
        if (*(Curl_easy **)((long)userp + 0x4a0) == data) {
          return 0;
        }
      }
      else {
        (pRVar2->http_wrapper).pausedata = mem + uVar3;
        (pRVar2->http_wrapper).pauselen = len - uVar3;
      }
      (data->conn->proto).httpc.pause_stream_id = stream_id;
      iVar4 = -0x20e;
    }
  }
  return iVar4;
}

Assistant:

static int on_data_chunk_recv(nghttp2_session *session, uint8_t flags,
                              int32_t stream_id,
                              const uint8_t *mem, size_t len, void *userp)
{
  struct HTTP *stream;
  struct Curl_easy *data_s;
  size_t nread;
  struct connectdata *conn = (struct connectdata *)userp;
  struct http_conn *httpc = &conn->proto.httpc;
  (void)session;
  (void)flags;

  DEBUGASSERT(stream_id); /* should never be a zero stream ID here */

  /* get the stream from the hash based on Stream ID */
  data_s = nghttp2_session_get_stream_user_data(session, stream_id);
  if(!data_s) {
    /* Receiving a Stream ID not in the hash should not happen - unless
       we have aborted a transfer artificially and there were more data
       in the pipeline. Silently ignore. */
    H2BUGF(fprintf(stderr, "Data for stream %u but it doesn't exist\n",
                   stream_id));
    return 0;
  }

  stream = data_s->req.p.http;
  if(!stream)
    return NGHTTP2_ERR_CALLBACK_FAILURE;

  nread = CURLMIN(stream->len, len);
  memcpy(&stream->mem[stream->memlen], mem, nread);

  stream->len -= nread;
  stream->memlen += nread;

  drain_this(data_s, &conn->proto.httpc);

  /* if we receive data for another handle, wake that up */
  if(get_transfer(httpc) != data_s)
    Curl_expire(data_s, 0, EXPIRE_RUN_NOW);

  H2BUGF(infof(data_s, "%zu data received for stream %u "
               "(%zu left in buffer %p, total %zu)",
               nread, stream_id,
               stream->len, stream->mem,
               stream->memlen));

  if(nread < len) {
    stream->pausedata = mem + nread;
    stream->pauselen = len - nread;
    H2BUGF(infof(data_s, "NGHTTP2_ERR_PAUSE - %zu bytes out of buffer"
                 ", stream %u",
                 len - nread, stream_id));
    data_s->conn->proto.httpc.pause_stream_id = stream_id;

    return NGHTTP2_ERR_PAUSE;
  }

  /* pause execution of nghttp2 if we received data for another handle
     in order to process them first. */
  if(get_transfer(httpc) != data_s) {
    data_s->conn->proto.httpc.pause_stream_id = stream_id;

    return NGHTTP2_ERR_PAUSE;
  }

  return 0;
}